

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_de3815.c
# Opt level: O3

mraa_board_t * mraa_intel_de3815(void)

{
  bool bVar1;
  int iVar2;
  mraa_board_t *__ptr;
  mraa_pininfo_t *__ptr_00;
  mraa_adv_func_t *pmVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  
  __ptr = (mraa_board_t *)calloc(1,0x5f0);
  if (__ptr != (mraa_board_t *)0x0) {
    __ptr->platform_name = "Intel DE3815";
    __ptr->phy_pin_count = 0x12;
    __ptr->pwm_default_period = 500;
    __ptr->pwm_max_period = 0x20c49b;
    __ptr->pwm_min_period = 1;
    __ptr_00 = (mraa_pininfo_t *)calloc(0x12,0x2f4);
    __ptr->pins = __ptr_00;
    if (__ptr_00 != (mraa_pininfo_t *)0x0) {
      pmVar3 = (mraa_adv_func_t *)calloc(1,0x288);
      __ptr->adv_func = pmVar3;
      if (pmVar3 != (mraa_adv_func_t *)0x0) {
        builtin_strncpy(__ptr_00->name,"1.8v",5);
        __ptr_00->name[5] = '\0';
        __ptr_00->name[6] = '\0';
        __ptr_00->name[7] = '\0';
        *(undefined1 *)&__ptr_00->capabilities = 1;
        __ptr_00[1].name[0] = 'G';
        __ptr_00[1].name[1] = 'N';
        __ptr_00[1].name[2] = 'D';
        __ptr_00[1].name[3] = '\0';
        __ptr_00[1].name[4] = '\0';
        __ptr_00[1].name[5] = '\0';
        __ptr_00[1].name[6] = '\0';
        __ptr_00[1].name[7] = '\0';
        *(undefined1 *)&__ptr_00[1].capabilities = 1;
        __ptr_00[2].name[0] = 'H';
        __ptr_00[2].name[1] = 'D';
        __ptr_00[2].name[2] = 'M';
        __ptr_00[2].name[3] = 'I';
        __ptr_00[2].name[4] = 'c';
        __ptr_00[2].name[5] = 'e';
        __ptr_00[2].name[6] = 'c';
        __ptr_00[2].name[7] = '\0';
        *(undefined1 *)&__ptr_00[2].capabilities = 1;
        __ptr_00[3].name[0] = 'D';
        __ptr_00[3].name[1] = 'M';
        __ptr_00[3].name[2] = 'I';
        __ptr_00[3].name[3] = 'C';
        __ptr_00[3].name[4] = 'c';
        __ptr_00[3].name[5] = 'l';
        __ptr_00[3].name[6] = 'k';
        __ptr_00[3].name[7] = '\0';
        *(undefined1 *)&__ptr_00[3].capabilities = 1;
        __ptr_00[4].name[0] = '3';
        __ptr_00[4].name[1] = '.';
        __ptr_00[4].name[2] = '3';
        __ptr_00[4].name[3] = 'v';
        __ptr_00[4].name[4] = '\0';
        __ptr_00[4].name[5] = '\0';
        __ptr_00[4].name[6] = '\0';
        __ptr_00[4].name[7] = '\0';
        *(undefined1 *)&__ptr_00[4].capabilities = 1;
        __ptr_00[5].name[0] = 'D';
        __ptr_00[5].name[1] = 'M';
        __ptr_00[5].name[2] = 'I';
        __ptr_00[5].name[3] = 'C';
        __ptr_00[5].name[4] = 'd';
        __ptr_00[5].name[5] = 'a';
        __ptr_00[5].name[6] = '\0';
        __ptr_00[5].name[7] = '\0';
        *(undefined1 *)&__ptr_00[5].capabilities = 1;
        __ptr_00[6].name[0] = 'K';
        __ptr_00[6].name[1] = 'e';
        __ptr_00[6].name[2] = 'y';
        __ptr_00[6].name[3] = '\0';
        __ptr_00[6].name[4] = '\0';
        __ptr_00[6].name[5] = '\0';
        __ptr_00[6].name[6] = '\0';
        __ptr_00[6].name[7] = '\0';
        *(undefined1 *)&__ptr_00[6].capabilities = 1;
        __ptr_00[7].name[0] = 'S';
        __ptr_00[7].name[1] = 'M';
        __ptr_00[7].name[2] = 'B';
        __ptr_00[7].name[3] = '-';
        __ptr_00[7].name[4] = 'A';
        __ptr_00[7].name[5] = '\0';
        __ptr_00[7].name[6] = '\0';
        __ptr_00[7].name[7] = '\0';
        *(undefined1 *)&__ptr_00[7].capabilities = 1;
        __ptr_00[8].name[0] = '5';
        __ptr_00[8].name[1] = 'v';
        __ptr_00[8].name[2] = '\0';
        __ptr_00[8].name[3] = '\0';
        __ptr_00[8].name[4] = '\0';
        __ptr_00[8].name[5] = '\0';
        __ptr_00[8].name[6] = '\0';
        __ptr_00[8].name[7] = '\0';
        *(undefined1 *)&__ptr_00[8].capabilities = 1;
        __ptr_00[9].name[0] = 'S';
        __ptr_00[9].name[1] = 'C';
        __ptr_00[9].name[2] = 'I';
        __ptr_00[9].name[3] = '\0';
        __ptr_00[9].name[4] = '\0';
        __ptr_00[9].name[5] = '\0';
        __ptr_00[9].name[6] = '\0';
        __ptr_00[9].name[7] = '\0';
        *(undefined1 *)&__ptr_00[9].capabilities = 1;
        __ptr_00[10].name[0] = 'P';
        __ptr_00[10].name[1] = 'W';
        __ptr_00[10].name[2] = 'M';
        __ptr_00[10].name[3] = '0';
        __ptr_00[10].name[4] = '\0';
        __ptr_00[10].name[5] = '\0';
        __ptr_00[10].name[6] = '\0';
        __ptr_00[10].name[7] = '\0';
        *(undefined1 *)&__ptr_00[10].capabilities = 5;
        __ptr_00[0xb].name[0] = 'P';
        __ptr_00[0xb].name[1] = 'W';
        __ptr_00[0xb].name[2] = 'M';
        __ptr_00[0xb].name[3] = '1';
        __ptr_00[0xb].name[4] = '\0';
        __ptr_00[0xb].name[5] = '\0';
        __ptr_00[0xb].name[6] = '\0';
        __ptr_00[0xb].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0xb].capabilities = 5;
        iVar6 = 1;
        __ptr_00[0xb].pwm.parent_id = 1;
        __ptr_00[0xc].name[0] = 'I';
        __ptr_00[0xc].name[1] = '2';
        __ptr_00[0xc].name[2] = 'C';
        __ptr_00[0xc].name[3] = '0';
        __ptr_00[0xc].name[4] = 'S';
        __ptr_00[0xc].name[5] = 'C';
        __ptr_00[0xc].name[6] = 'L';
        __ptr_00[0xc].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0xc].capabilities = 0x21;
        __ptr_00[0xc].i2c.pinmap = 1;
        __ptr_00[0xd].name[0] = 'I';
        __ptr_00[0xd].name[1] = '2';
        __ptr_00[0xd].name[2] = 'C';
        __ptr_00[0xd].name[3] = '0';
        __ptr_00[0xd].name[4] = 'S';
        __ptr_00[0xd].name[5] = 'D';
        __ptr_00[0xd].name[6] = 'A';
        __ptr_00[0xd].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0xd].capabilities = 0x21;
        __ptr_00[0xd].i2c.pinmap = 1;
        __ptr_00[0xe].name[0] = 'I';
        __ptr_00[0xe].name[1] = '2';
        __ptr_00[0xe].name[2] = 'C';
        __ptr_00[0xe].name[3] = '1';
        __ptr_00[0xe].name[4] = 'S';
        __ptr_00[0xe].name[5] = 'C';
        __ptr_00[0xe].name[6] = 'L';
        __ptr_00[0xe].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0xe].capabilities = 0x21;
        __ptr_00[0xe].i2c.pinmap = 1;
        __ptr_00[0xf].name[0] = 'I';
        __ptr_00[0xf].name[1] = '2';
        __ptr_00[0xf].name[2] = 'C';
        __ptr_00[0xf].name[3] = '1';
        __ptr_00[0xf].name[4] = 'S';
        __ptr_00[0xf].name[5] = 'D';
        __ptr_00[0xf].name[6] = 'A';
        __ptr_00[0xf].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0xf].capabilities = 0x21;
        __ptr_00[0xf].i2c.pinmap = 1;
        __ptr_00[0x10].name[0] = 'S';
        __ptr_00[0x10].name[1] = 'M';
        __ptr_00[0x10].name[2] = 'B';
        __ptr_00[0x10].name[3] = '_';
        __ptr_00[0x10].name[4] = 'C';
        __ptr_00[0x10].name[5] = 'L';
        __ptr_00[0x10].name[6] = 'K';
        __ptr_00[0x10].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0x10].capabilities = 1;
        __ptr_00[0x11].name[0] = 'S';
        __ptr_00[0x11].name[1] = 'M';
        __ptr_00[0x11].name[2] = 'B';
        __ptr_00[0x11].name[3] = '_';
        __ptr_00[0x11].name[4] = 'S';
        __ptr_00[0x11].name[5] = 'D';
        __ptr_00[0x11].name[6] = 'A';
        __ptr_00[0x11].name[7] = '\0';
        *(undefined1 *)&__ptr_00[0x11].capabilities = 1;
        iVar2 = -1;
        lVar5 = 0;
        bVar1 = true;
        do {
          bVar4 = bVar1;
          iVar2 = mraa_find_i2c_bus("designware",iVar2 + 1);
          if (iVar2 == -1) {
            if (iVar6 == 1) goto LAB_00119c82;
            break;
          }
          __ptr->i2c_bus_count = iVar6;
          __ptr->i2c_bus[lVar5].bus_id = iVar2;
          __ptr->i2c_bus[lVar5].sda = (uint)lVar5 | 0xc;
          __ptr->i2c_bus[lVar5].scl = (uint)lVar5 + 0xd;
          iVar6 = iVar6 + 1;
          lVar5 = 1;
          bVar1 = false;
        } while (bVar4);
        __ptr->def_i2c_bus = __ptr->i2c_bus[0].bus_id;
LAB_00119c82:
        __ptr->spi_bus_count = 1;
        __ptr->spi_bus[0].bus_id = 1;
        __ptr->spi_bus[0].sclk = 0xd;
        __ptr->spi_bus[0].mosi = 0xb;
        __ptr->spi_bus[0].miso = 0xc;
        __ptr->spi_bus[0].cs = 10;
        return __ptr;
      }
      free(__ptr_00);
    }
    syslog(2,"de3815: Platform failed to initialise");
    free(__ptr);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_de3815()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->phy_pin_count = MRAA_INTEL_DE3815_PINCOUNT;
    b->aio_count = 0;
    b->adc_raw = 0;
    b->adc_supported = 0;
    b->pwm_default_period = 500;
    b->pwm_max_period = 2147483;
    b->pwm_min_period = 1;

    b->pins = (mraa_pininfo_t*) calloc(MRAA_INTEL_DE3815_PINCOUNT,sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    strncpy(b->pins[0].name, "1.8v", 8);
    b->pins[0].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    strncpy(b->pins[1].name, "GND", 8);
    b->pins[1].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[2].name, "HDMIcec", 8);
    b->pins[2].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[3].name, "DMICclk", 8);
    b->pins[3].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[4].name, "3.3v", 8);
    b->pins[4].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[5].name, "DMICda", 8);
    b->pins[5].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[6].name, "Key", 8);
    b->pins[6].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[7].name, "SMB-A", 8);
    b->pins[7].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[8].name, "5v", 8);
    b->pins[8].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[9].name, "SCI", 8);
    b->pins[9].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    strncpy(b->pins[10].name, "PWM0", 8);
    b->pins[10].capabilities = (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 };
    b->pins[10].pwm.pinmap = 0;
    b->pins[10].pwm.parent_id = 0;
    b->pins[10].pwm.mux_total = 0;

    strncpy(b->pins[11].name, "PWM1", 8);
    b->pins[11].capabilities = (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 };
    b->pins[11].pwm.pinmap = 0;
    b->pins[11].pwm.parent_id = 1;
    b->pins[11].pwm.mux_total = 0;

    strncpy(b->pins[12].name, "I2C0SCL", 8);
    b->pins[12].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[12].i2c.pinmap = 1;
    b->pins[12].i2c.mux_total = 0;

    strncpy(b->pins[13].name, "I2C0SDA", 8);
    b->pins[13].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[13].i2c.pinmap = 1;
    b->pins[13].i2c.mux_total = 0;

    strncpy(b->pins[14].name, "I2C1SCL", 8);
    b->pins[14].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[14].i2c.pinmap = 1;
    b->pins[14].i2c.mux_total = 0;

    strncpy(b->pins[15].name, "I2C1SDA", 8);
    b->pins[15].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[15].i2c.pinmap = 1;
    b->pins[15].i2c.mux_total = 0;

    strncpy(b->pins[16].name, "SMB_CLK", 8);
    b->pins[16].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[17].name, "SMB_SDA", 8);
    b->pins[17].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    b->i2c_bus_count = 0;
    int i2c_num = -1;
    int i;
    for (i = 0; i < 2; i++) {
        i2c_num = mraa_find_i2c_bus(I2CNAME, i2c_num + 1);
        if (i2c_num == -1) {
            break;
        }
        b->i2c_bus_count++;
        b->i2c_bus[i].bus_id = i2c_num;
        b->i2c_bus[i].sda = 12 + i;
        b->i2c_bus[i].scl = 13 + i;
    }

    if (b->i2c_bus_count > 0) {
        b->def_i2c_bus = b->i2c_bus[0].bus_id;
    }


    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 1;
    b->spi_bus[0].slave_s = 0;
    b->spi_bus[0].cs = 10;
    b->spi_bus[0].mosi = 11;
    b->spi_bus[0].miso = 12;
    b->spi_bus[0].sclk = 13;

    b->uart_dev_count = 0;

    return b;
error:
    syslog(LOG_CRIT, "de3815: Platform failed to initialise");
    free(b);
    return NULL;
}